

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O0

int __thiscall
Imf_2_5::TypedAttribute<Imf_2_5::Rational>::copy
          (TypedAttribute<Imf_2_5::Rational> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  long *plVar1;
  Attribute *attribute;
  TypedAttribute<Imf_2_5::Rational> *in_stack_ffffffffffffffe0;
  
  plVar1 = (long *)operator_new(0x10);
  *plVar1 = 0;
  plVar1[1] = 0;
  TypedAttribute(in_stack_ffffffffffffffe0);
  (**(code **)(*plVar1 + 0x30))(plVar1,this);
  return (int)plVar1;
}

Assistant:

Attribute *
TypedAttribute<T>::copy () const
{
    Attribute * attribute = new TypedAttribute<T>();
    attribute->copyValueFrom (*this);
    return attribute;
}